

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O3

int Dar_ManRefactor(Aig_Man_t *pAig,Dar_RefPar_t *pPars)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  Aig_Obj_t *pNode;
  Dar_RefPar_t *pDVar4;
  undefined8 uVar5;
  Kit_Graph_t *pGraph;
  Vec_Ptr_t *vLeaves;
  int iVar6;
  int iVar7;
  Ref_Man_t *pRVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Obj_t *pObjNew;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  timespec ts;
  timespec local_78;
  int local_64;
  Ref_Man_t *local_60;
  int local_58;
  int local_54;
  Vec_Ptr_t *local_50;
  long local_48;
  Vec_Ptr_t *local_40;
  ulong local_38;
  
  pRVar8 = Dar_ManRefStart(pAig,pPars);
  Aig_ManCleanup(pAig);
  Aig_ManFanoutStart(pAig);
  if (pRVar8->pPars->fUpdateLevel != 0) {
    Aig_ManStartReverseLevels(pAig,0);
  }
  iVar6 = clock_gettime(3,&local_78);
  if (iVar6 < 0) {
    local_48 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_48 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  iVar6 = pRVar8->vCuts->nSize;
  if ((iVar6 < 1) || (iVar6 == 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
  }
  ppvVar3 = pRVar8->vCuts->pArray;
  local_40 = (Vec_Ptr_t *)*ppvVar3;
  local_50 = (Vec_Ptr_t *)ppvVar3[1];
  pRVar8->nNodesInit = pAig->nObjs[6] + pAig->nObjs[5];
  pVVar9 = pAig->vObjs;
  local_38 = (ulong)pVVar9->nSize;
  if (0 < (long)local_38) {
    uVar13 = 0;
    local_60 = pRVar8;
    do {
      pNode = (Aig_Obj_t *)pVVar9->pArray[uVar13];
      if ((pNode != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7)) {
        if (local_38 < uVar13) break;
        if ((((uint)uVar13 >> 8 & 1) == 0) && (pAig->Time2Quit != 0)) {
          iVar6 = clock_gettime(3,&local_78);
          if (iVar6 < 0) {
            lVar10 = -1;
          }
          else {
            lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
          }
          if (pAig->Time2Quit < lVar10) break;
        }
        lVar10 = (long)pRVar8->vCuts->nSize;
        if (0 < lVar10) {
          ppvVar3 = pRVar8->vCuts->pArray;
          lVar11 = 0;
          do {
            *(undefined4 *)((long)ppvVar3[lVar11] + 4) = 0;
            lVar11 = lVar11 + 1;
          } while (lVar10 != lVar11);
        }
        iVar6 = clock_gettime(3,&local_78);
        pVVar9 = local_40;
        if (iVar6 < 0) {
          lVar10 = 1;
        }
        else {
          lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
          lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_78.tv_sec * -1000000;
        }
        if (((ulong)pNode & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
        }
        uVar14 = *(uint *)&pNode->field_0x1c & 0xffffff;
        if (uVar14 < 0xb) {
          uVar14 = 10;
        }
        iVar6 = Aig_NodeMffcSupp(pAig,pNode,uVar14 - 10,local_40);
        vLeaves = local_40;
        pDVar4 = pRVar8->pPars;
        if (iVar6 < pDVar4->nMffcMin) {
          iVar6 = clock_gettime(3,&local_78);
          if (iVar6 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
          }
          local_60->timeCuts = local_60->timeCuts + lVar11 + lVar10;
          pRVar8 = local_60;
        }
        else {
          pRVar8->nNodesTried = pRVar8->nNodesTried + 1;
          uVar1 = pVVar9->nSize;
          iVar7 = pDVar4->nLeafMax;
          if (iVar7 < (int)uVar1) {
            Aig_ManFindCut(pNode,pVVar9,pRVar8->vCutNodes,iVar7,0x32);
            local_64 = Aig_NodeMffcLabelCut(pRVar8->pAig,pNode,pVVar9);
          }
          else {
            pRVar8 = local_60;
            local_64 = iVar6;
            if (((int)uVar1 < iVar7 + -2) && (pDVar4->fExtend != 0)) {
              if (0 < (int)uVar1) {
                uVar12 = 0;
                do {
                  uVar5 = *(undefined8 *)((long)local_40->pArray[uVar12] + 0x18);
                  if ((((uint)uVar5 & 7) != 2) &&
                     ((int)((uint)((ulong)uVar5 >> 0x20) & 0xffffff) <= (int)(uVar14 - 10))) {
                    local_60->nNodesBelow = local_60->nNodesBelow + 1;
                    goto LAB_004fa20a;
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar1 != uVar12);
              }
              iVar6 = Aig_NodeMffcExtendCut(pAig,pNode,local_40,local_50);
              if ((iVar6 != 0) &&
                 (iVar6 = Aig_NodeMffcLabelCut(local_60->pAig,pNode,vLeaves), iVar6 != local_64)) {
                __assert_fail("nNodesSaved2 == nNodesSaved",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                              ,0x22c,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
              }
              pRVar8 = local_60;
              if (pDVar4->nLeafMax < local_50->nSize) {
                local_50->nSize = 0;
              }
              else if (0 < local_50->nSize) {
                local_60->nNodesExten = local_60->nNodesExten + 1;
              }
            }
          }
LAB_004fa20a:
          iVar6 = clock_gettime(3,&local_78);
          if (iVar6 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
          }
          pRVar8->timeCuts = pRVar8->timeCuts + lVar11 + lVar10;
          iVar6 = clock_gettime(3,&local_78);
          if (iVar6 < 0) {
            lVar10 = 1;
          }
          else {
            lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
            lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_78.tv_sec * -1000000;
          }
          if (pAig->vLevelR == (Vec_Int_t *)0x0) {
            iVar6 = 1000000000;
          }
          else {
            iVar6 = Aig_ObjRequiredLevel(pAig,pNode);
          }
          Dar_ManRefactorTryCuts(pRVar8,pNode,local_64,iVar6);
          iVar7 = clock_gettime(3,&local_78);
          if (iVar7 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
          }
          pRVar8->timeEval = pRVar8->timeEval + lVar11 + lVar10;
          iVar7 = pRVar8->GainBest;
          if ((iVar7 < 1) && ((iVar7 != 0 || (pRVar8->pPars->fUseZeros == 0)))) {
            if (pRVar8->pGraphBest != (Kit_Graph_t *)0x0) {
              Kit_GraphFree(pRVar8->pGraphBest);
            }
          }
          else {
            local_58 = pAig->nObjs[5];
            iVar2 = pAig->nObjs[6];
            pGraph = pRVar8->pGraphBest;
            local_64 = iVar6;
            local_54 = iVar7;
            pObjNew = Dar_RefactBuildGraph(pAig,pRVar8->vLeavesBest,pGraph);
            if (local_64 < (int)(*(uint *)(((ulong)pObjNew & 0xfffffffffffffffe) + 0x1c) & 0xffffff)
               ) {
              __assert_fail("(int)Aig_Regular(pObjNew)->Level <= Required",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                            ,0x24d,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
            }
            Aig_ObjReplace(pAig,pNode,pObjNew,pRVar8->pPars->fUpdateLevel);
            if ((iVar2 + local_58) - (pAig->nObjs[5] + pAig->nObjs[6]) < local_54) {
              __assert_fail("p->GainBest <= nNodeBefore - nNodeAfter",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                            ,0x252,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
            }
            Kit_GraphFree(pGraph);
            pRVar8->nCutsUsed = pRVar8->nCutsUsed + 1;
          }
        }
      }
      uVar13 = uVar13 + 1;
      pVVar9 = pAig->vObjs;
    } while ((long)uVar13 < (long)pVVar9->nSize);
  }
  iVar6 = clock_gettime(3,&local_78);
  if (iVar6 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  pRVar8->timeTotal = lVar10 + local_48;
  pRVar8->timeOther = (lVar10 + local_48) - (pRVar8->timeCuts + pRVar8->timeEval);
  Aig_ManFanoutStop(pAig);
  if (pRVar8->pPars->fUpdateLevel != 0) {
    Aig_ManStopReverseLevels(pAig);
  }
  Aig_ManCleanup(pAig);
  Dar_ManRefStop(pRVar8);
  iVar6 = Aig_ManCheck(pAig);
  if (iVar6 == 0) {
    puts("Dar_ManRefactor: The network check has failed.");
  }
  return (uint)(iVar6 != 0);
}

Assistant:

int Dar_ManRefactor( Aig_Man_t * pAig, Dar_RefPar_t * pPars )
{
//    Bar_Progress_t * pProgress;
    Ref_Man_t * p;
    Vec_Ptr_t * vCut, * vCut2;
    Aig_Obj_t * pObj, * pObjNew;
    int nNodesOld, nNodeBefore, nNodeAfter, nNodesSaved, nNodesSaved2;
    int i, Required, nLevelMin;
    abctime clkStart, clk;

    // start the manager
    p = Dar_ManRefStart( pAig, pPars );
    // remove dangling nodes
    Aig_ManCleanup( pAig );
    // if updating levels is requested, start fanout and timing
    Aig_ManFanoutStart( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStartReverseLevels( pAig, 0 );

    // resynthesize each node once
    clkStart = Abc_Clock();
    vCut = Vec_VecEntry( p->vCuts, 0 );
    vCut2 = Vec_VecEntry( p->vCuts, 1 );
    p->nNodesInit = Aig_ManNodeNum(pAig);
    nNodesOld = Vec_PtrSize( pAig->vObjs );
//    pProgress = Bar_ProgressStart( stdout, nNodesOld );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( i > nNodesOld )
            break;
        if ( pAig->Time2Quit && !(i & 256) && Abc_Clock() > pAig->Time2Quit )
            break;
        Vec_VecClear( p->vCuts );

//printf( "\nConsidering node %d.\n", pObj->Id );
        // get the bounded MFFC size
clk = Abc_Clock();
        nLevelMin = Abc_MaxInt( 0, Aig_ObjLevel(pObj) - 10 );
        nNodesSaved = Aig_NodeMffcSupp( pAig, pObj, nLevelMin, vCut );
        if ( nNodesSaved < p->pPars->nMffcMin ) // too small to consider
        {
p->timeCuts += Abc_Clock() - clk;
            continue; 
        }
        p->nNodesTried++;
        if ( Vec_PtrSize(vCut) > p->pPars->nLeafMax ) // get one reconv-driven cut
        {
            Aig_ManFindCut( pObj, vCut, p->vCutNodes, p->pPars->nLeafMax, 50 );
            nNodesSaved = Aig_NodeMffcLabelCut( p->pAig, pObj, vCut );
        }
        else if ( Vec_PtrSize(vCut) < p->pPars->nLeafMax - 2 && p->pPars->fExtend )
        {
            if ( !Dar_ObjCutLevelAchieved(vCut, nLevelMin) )
            {
                if ( Aig_NodeMffcExtendCut( pAig, pObj, vCut, vCut2 ) )
                {
                    nNodesSaved2 = Aig_NodeMffcLabelCut( p->pAig, pObj, vCut );
                    assert( nNodesSaved2 == nNodesSaved );
                }
                if ( Vec_PtrSize(vCut2) > p->pPars->nLeafMax )
                    Vec_PtrClear(vCut2);
                if ( Vec_PtrSize(vCut2) > 0 )
                {
                    p->nNodesExten++;
//                    printf( "%d(%d) ", Vec_PtrSize(vCut), Vec_PtrSize(vCut2) );
                }
            }
            else
                p->nNodesBelow++;
        }
p->timeCuts += Abc_Clock() - clk;

        // try the cuts
clk = Abc_Clock();
        Required = pAig->vLevelR? Aig_ObjRequiredLevel(pAig, pObj) : ABC_INFINITY;
        Dar_ManRefactorTryCuts( p, pObj, nNodesSaved, Required );
p->timeEval += Abc_Clock() - clk;

        // check the best gain
        if ( !(p->GainBest > 0 || (p->GainBest == 0 && p->pPars->fUseZeros)) )
        {
            if ( p->pGraphBest )
                Kit_GraphFree( p->pGraphBest );
            continue;
        }
//printf( "\n" );

        // if we end up here, a rewriting step is accepted
        nNodeBefore = Aig_ManNodeNum( pAig );
        pObjNew = Dar_RefactBuildGraph( pAig, p->vLeavesBest, p->pGraphBest );
        assert( (int)Aig_Regular(pObjNew)->Level <= Required );
        // replace the node
        Aig_ObjReplace( pAig, pObj, pObjNew, p->pPars->fUpdateLevel );
        // compare the gains
        nNodeAfter = Aig_ManNodeNum( pAig );
        assert( p->GainBest <= nNodeBefore - nNodeAfter );
        Kit_GraphFree( p->pGraphBest );
        p->nCutsUsed++;
//        break;
    }
p->timeTotal = Abc_Clock() - clkStart;
p->timeOther = p->timeTotal - p->timeCuts - p->timeEval;

//    Bar_ProgressStop( pProgress );
    // put the nodes into the DFS order and reassign their IDs
//    Aig_NtkReassignIds( p );
    // fix the levels
    Aig_ManFanoutStop( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStopReverseLevels( pAig );
/*
    Aig_ManForEachObj( p->pAig, pObj, i )
        if ( Aig_ObjIsNode(pObj) && Aig_ObjRefs(pObj) == 0 )
        {
            printf( "Unreferenced " );
            Aig_ObjPrintVerbose( pObj, 0 );
            printf( "\n" );
        }
*/
    // remove dangling nodes (they should not be here!)
    Aig_ManCleanup( pAig );

    // stop the rewriting manager
    Dar_ManRefStop( p );
//    Aig_ManCheckPhase( pAig );
    if ( !Aig_ManCheck( pAig ) )
    {
        printf( "Dar_ManRefactor: The network check has failed.\n" );
        return 0;
    }
    return 1;

}